

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

bool __thiscall
loader::context_t::driverSorting
          (context_t *this,driver_vector_t *drivers,ze_init_driver_type_desc_t *desc,bool sysmanOnly
          )

{
  ze_pfnInitDrivers_t p_Var1;
  ze_pfnDriverGet_t p_Var2;
  ze_pfnDeviceGet_t p_Var3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  bool bVar7;
  __type_conflict1 _Var8;
  bool bVar9;
  ze_result_t zVar10;
  reference pdVar11;
  reference pdVar12;
  _ze_driver_handle_t **pp_Var13;
  reference pp_Var14;
  ulong __n;
  _ze_device_handle_t **pp_Var15;
  reference pp_Var16;
  iterator __first;
  iterator __last;
  allocator local_c21;
  string local_c20 [32];
  string local_c00 [32];
  __cxx11 local_be0 [32];
  string local_bc0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80 [32];
  reference local_b60;
  driver_t *driver_1;
  iterator __end2_1;
  iterator __begin2_1;
  driver_vector_t *__range2_1;
  string local_b38 [8];
  string message_14;
  loader local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8 [8];
  string message_13;
  undefined1 local_a88 [8];
  ze_device_properties_t deviceProperties;
  _ze_device_handle_t *device;
  iterator __end3_1;
  iterator __begin3_1;
  vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> *__range3_1;
  loader local_8f0 [5];
  bool other;
  bool discreteGPU;
  bool integratedGPU;
  string local_8d0 [32];
  string local_8b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890 [8];
  string message_12;
  allocator<_ze_device_handle_t_*> local_869;
  undefined1 local_868 [8];
  vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> deviceHandles;
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8 [8];
  string message_11;
  loader local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768 [8];
  string message_10;
  uint32_t local_744;
  loader local_740 [4];
  uint32_t deviceCount;
  string local_720 [32];
  string local_700 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0 [8];
  string message_9;
  undefined1 auStack_6b8 [4];
  ze_result_t res_1;
  ze_driver_properties_t properties;
  _ze_driver_handle_t *handle;
  iterator __end2;
  iterator __begin2;
  vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *__range2;
  string local_650 [32];
  string local_630 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [8];
  string message_8;
  loader local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590 [8];
  string message_7;
  loader local_570 [32];
  string local_550 [32];
  string local_530 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510 [8];
  string message_6;
  allocator local_4e9;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488 [8];
  string message_5;
  loader local_468 [32];
  string local_448 [32];
  string local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [8];
  string message_4;
  loader local_3e8 [32];
  string local_3c8 [32];
  loader local_3a8 [32];
  string local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328 [8];
  string message_3;
  loader local_308 [32];
  string local_2e8 [32];
  loader local_2c8 [32];
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [8];
  string message_2;
  allocator local_221;
  string local_220 [32];
  string local_200 [32];
  loader local_1e0 [32];
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [8];
  string message_1;
  loader local_138 [32];
  string local_118 [48];
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [8];
  string message;
  undefined1 local_a0 [4];
  ze_result_t res;
  vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> driverHandles;
  uint32_t pCount;
  driver_t *coreDriver;
  iterator __end3;
  iterator __begin3;
  driver_vector_t *__range3;
  driver_t *driver;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_init_driver_type_desc_t permissiveDesc;
  bool sysmanOnly_local;
  ze_init_driver_type_desc_t *desc_local;
  driver_vector_t *drivers_local;
  context_t *this_local;
  
  permissiveDesc._23_1_ = sysmanOnly;
  memset(&__range1,0,0x18);
  __range1._0_4_ = 0x20021;
  permissiveDesc.stype = 0;
  permissiveDesc._4_4_ = 0;
  permissiveDesc.pNext._0_4_ = 0xffffffff;
  __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(drivers);
  driver = (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(drivers);
  do {
    bVar7 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                *)&driver);
    if (!bVar7) {
      __first = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(drivers);
      __last = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(drivers);
      std::
      sort<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,bool(*)(loader::driver_t_const&,loader::driver_t_const&)>
                ((__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                  )__first._M_current,
                 (__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                  )__last._M_current,driverSortComparator);
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b38,"Drivers after sorting:",(allocator *)((long)&__range2_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
        __end2_1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(drivers);
        driver_1 = (driver_t *)
                   std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(drivers);
        while (bVar7 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                   *)&driver_1), bVar7) {
          local_b60 = __gnu_cxx::
                      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                      ::operator*(&__end2_1);
          std::__cxx11::to_string(local_be0,local_b60->driverType);
          std::operator+((char *)local_bc0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\nDriver Type: ");
          std::operator+(local_ba0,(char *)local_bc0);
          std::operator+(local_b80,local_ba0);
          std::__cxx11::string::operator+=(local_b38,(string *)local_b80);
          std::__cxx11::string::~string((string *)local_b80);
          std::__cxx11::string::~string((string *)local_ba0);
          std::__cxx11::string::~string(local_bc0);
          std::__cxx11::string::~string((string *)local_be0);
          __gnu_cxx::
          __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
          ::operator++(&__end2_1);
        }
        std::__cxx11::string::string(local_c00,local_b38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c20,"",&local_c21);
        debug_trace_message(this,(string *)local_c00,(string *)local_c20);
        std::__cxx11::string::~string(local_c20);
        std::allocator<char>::~allocator((allocator<char> *)&local_c21);
        std::__cxx11::string::~string(local_c00);
        std::__cxx11::string::~string(local_b38);
      }
      return true;
    }
    pdVar11 = __gnu_cxx::
              __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
              ::operator*(&__end1);
    if ((permissiveDesc._23_1_ & 1) != 0) {
      __end3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin
                         (&this->zeDrivers);
      coreDriver = (driver_t *)
                   std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end
                             (&this->zeDrivers);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                         *)&coreDriver), bVar7) {
        pdVar12 = __gnu_cxx::
                  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                  ::operator*(&__end3);
        _Var8 = std::operator==(&pdVar12->name,&pdVar11->name);
        if (_Var8) {
          if ((pdVar11->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0) {
            (pdVar11->dditable).ze.Global.pfnInitDrivers =
                 (pdVar12->dditable).ze.Global.pfnInitDrivers;
          }
          if ((pdVar11->dditable).ze.Driver.pfnGet == (ze_pfnDriverGet_t)0x0) {
            (pdVar11->dditable).ze.Driver.pfnGet = (pdVar12->dditable).ze.Driver.pfnGet;
          }
          if ((pdVar11->dditable).ze.Driver.pfnGetProperties == (ze_pfnDriverGetProperties_t)0x0) {
            (pdVar11->dditable).ze.Driver.pfnGetProperties =
                 (pdVar12->dditable).ze.Driver.pfnGetProperties;
          }
          if ((pdVar11->dditable).ze.Device.pfnGet == (ze_pfnDeviceGet_t)0x0) {
            (pdVar11->dditable).ze.Device.pfnGet = (pdVar12->dditable).ze.Device.pfnGet;
          }
          if ((pdVar11->dditable).ze.Device.pfnGetProperties == (ze_pfnDeviceGetProperties_t)0x0) {
            (pdVar11->dditable).ze.Device.pfnGetProperties =
                 (pdVar12->dditable).ze.Device.pfnGetProperties;
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
        ::operator++(&__end3);
      }
    }
    driverHandles.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::vector
              ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *)local_a0);
    if ((desc == (ze_init_driver_type_desc_t *)0x0) ||
       ((pdVar11->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0)) {
      if ((pdVar11->dditable).ze.Driver.pfnGet == (ze_pfnDriverGet_t)0x0) {
        if ((this->debugTraceEnabled & 1U) != 0) {
          std::operator+((char *)local_630,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "driverSorting ");
          std::operator+(local_610,(char *)local_630);
          std::__cxx11::string::~string(local_630);
          std::__cxx11::string::string(local_650,(string *)local_610);
          to_string_abi_cxx11_((loader *)&__range2,ZE_RESULT_SUCCESS);
          debug_trace_message(this,(string *)local_650,(string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
          std::__cxx11::string::~string(local_650);
          std::__cxx11::string::~string((string *)local_610);
        }
      }
      else if ((pdVar11->initStatus == ZE_RESULT_SUCCESS) &&
              ((pdVar11->legacyInitAttempted & 1U) != 0)) {
        if ((this->debugTraceEnabled & 1U) != 0) {
          std::operator+((char *)local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "driverSorting ");
          std::operator+(local_488,(char *)local_4a8);
          std::__cxx11::string::~string(local_4a8);
          std::__cxx11::string::string(local_4c8,(string *)local_488);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_4e8,"",&local_4e9);
          debug_trace_message(this,(string *)local_4c8,(string *)local_4e8);
          std::__cxx11::string::~string(local_4e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
          std::__cxx11::string::~string(local_4c8);
          std::__cxx11::string::~string((string *)local_488);
        }
        zVar10 = (*(pdVar11->dditable).ze.Driver.pfnGet)
                           ((uint32_t *)
                            ((long)&driverHandles.
                                    super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (ze_driver_handle_t *)0x0);
        if (zVar10 == ZE_RESULT_SUCCESS) {
          std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                    ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *)
                     local_a0,(ulong)driverHandles.
                                     super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          p_Var2 = (pdVar11->dditable).ze.Driver.pfnGet;
          pp_Var13 = std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::
                     data((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *)
                          local_a0);
          zVar10 = (*p_Var2)((uint32_t *)
                             ((long)&driverHandles.
                                     super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             pp_Var13);
          if (zVar10 == ZE_RESULT_SUCCESS) goto LAB_00435d2a;
          if ((this->debugTraceEnabled & 1U) != 0) {
            std::operator+((char *)local_5b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "driverSorting ");
            std::operator+(local_590,(char *)local_5b0);
            std::__cxx11::string::~string(local_5b0);
            std::__cxx11::string::string(local_5d0,(string *)local_590);
            to_string_abi_cxx11_(local_5f0,zVar10);
            debug_trace_message(this,(string *)local_5d0,(string *)local_5f0);
            std::__cxx11::string::~string((string *)local_5f0);
            std::__cxx11::string::~string(local_5d0);
            std::__cxx11::string::~string((string *)local_590);
          }
        }
        else if ((this->debugTraceEnabled & 1U) != 0) {
          std::operator+((char *)local_530,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "driverSorting ");
          std::operator+(local_510,(char *)local_530);
          std::__cxx11::string::~string(local_530);
          std::__cxx11::string::string(local_550,(string *)local_510);
          to_string_abi_cxx11_(local_570,zVar10);
          debug_trace_message(this,(string *)local_550,(string *)local_570);
          std::__cxx11::string::~string((string *)local_570);
          std::__cxx11::string::~string(local_550);
          std::__cxx11::string::~string((string *)local_510);
        }
      }
      else if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "driverSorting ");
        std::operator+(local_408,(char *)local_428);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::string(local_448,(string *)local_408);
        to_string_abi_cxx11_(local_468,pdVar11->initStatus);
        debug_trace_message(this,(string *)local_448,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string((string *)local_408);
      }
    }
    else if (pdVar11->initDriversStatus == ZE_RESULT_SUCCESS) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "driverSorting ");
        std::operator+(local_1a0,(char *)local_1c0);
        to_string_abi_cxx11_(local_1e0,(ze_init_driver_type_desc_t *)&__range1);
        std::operator+(local_180,local_1a0);
        std::operator+(local_160,(char *)local_180);
        std::__cxx11::string::~string((string *)local_180);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::~string((string *)local_1a0);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::string(local_200,(string *)local_160);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"",&local_221);
        debug_trace_message(this,(string *)local_200,(string *)local_220);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        std::__cxx11::string::~string(local_200);
        std::__cxx11::string::~string((string *)local_160);
      }
      driverHandles.
      super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      zVar10 = (*(pdVar11->dditable).ze.Global.pfnInitDrivers)
                         ((uint32_t *)
                          ((long)&driverHandles.
                                  super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          (ze_driver_handle_t *)0x0,(ze_init_driver_type_desc_t *)&__range1);
      if (zVar10 == ZE_RESULT_SUCCESS) {
        std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                  ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *)local_a0
                   ,(ulong)driverHandles.
                           super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        p_Var1 = (pdVar11->dditable).ze.Global.pfnInitDrivers;
        pp_Var13 = std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::data
                             ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                               *)local_a0);
        zVar10 = (*p_Var1)((uint32_t *)
                           ((long)&driverHandles.
                                   super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pp_Var13,
                           (ze_init_driver_type_desc_t *)&__range1);
        if (zVar10 == ZE_RESULT_SUCCESS) {
LAB_00435d2a:
          __end2 = std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::begin
                             ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                               *)local_a0);
          handle = (_ze_driver_handle_t *)
                   std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::end
                             ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                               *)local_a0);
          while (bVar7 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<_ze_driver_handle_t_**,_std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>_>
                                             *)&handle), bVar7) {
            pp_Var14 = __gnu_cxx::
                       __normal_iterator<_ze_driver_handle_t_**,_std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>_>
                       ::operator*(&__end2);
            properties._32_8_ = *pp_Var14;
            properties.pNext = (void *)0x0;
            properties.uuid.id[0] = '\0';
            properties.uuid.id[1] = '\0';
            properties.uuid.id[2] = '\0';
            properties.uuid.id[3] = '\0';
            properties.uuid.id[4] = '\0';
            properties.uuid.id[5] = '\0';
            properties.uuid.id[6] = '\0';
            properties.uuid.id[7] = '\0';
            properties.uuid.id[8] = '\0';
            properties.uuid.id[9] = '\0';
            properties.uuid.id[10] = '\0';
            properties.uuid.id[0xb] = '\0';
            properties.uuid.id[0xc] = '\0';
            properties.uuid.id[0xd] = '\0';
            properties.uuid.id[0xe] = '\0';
            properties.uuid.id[0xf] = '\0';
            auStack_6b8 = (undefined1  [4])0x1;
            res_1 = 0;
            properties.stype = 0;
            properties._4_4_ = 0;
            zVar10 = (*(pdVar11->dditable).ze.Driver.pfnGetProperties)
                               ((ze_driver_handle_t)properties._32_8_,
                                (ze_driver_properties_t *)auStack_6b8);
            if (zVar10 == ZE_RESULT_SUCCESS) {
              *(undefined8 *)&(pdVar11->properties).driverVersion = properties.uuid.id._8_8_;
              *(undefined4 *)(pdVar11->properties).uuid.id = properties.pNext._0_4_;
              *(undefined4 *)((pdVar11->properties).uuid.id + 4) = properties.pNext._4_4_;
              *(undefined4 *)((pdVar11->properties).uuid.id + 8) = properties.uuid.id._0_4_;
              *(undefined4 *)((pdVar11->properties).uuid.id + 0xc) = properties.uuid.id._4_4_;
              (pdVar11->properties).stype = (ze_structure_type_t)auStack_6b8;
              *(ze_result_t *)&(pdVar11->properties).field_0x4 = res_1;
              *(ze_structure_type_t *)&(pdVar11->properties).pNext = properties.stype;
              *(undefined4 *)((long)&(pdVar11->properties).pNext + 4) = properties._4_4_;
              local_744 = 0;
              zVar10 = (*(pdVar11->dditable).ze.Device.pfnGet)
                                 ((ze_driver_handle_t)properties._32_8_,&local_744,
                                  (ze_device_handle_t *)0x0);
              if (zVar10 == ZE_RESULT_SUCCESS) {
                if (local_744 == 0) {
                  if ((this->debugTraceEnabled & 1U) != 0) {
                    std::operator+((char *)local_808,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"driverSorting ");
                    std::operator+(local_7e8,(char *)local_808);
                    std::__cxx11::string::~string(local_808);
                    std::__cxx11::string::string(local_828,(string *)local_7e8);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_848,"",
                               (allocator *)
                               ((long)&deviceHandles.
                                       super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    debug_trace_message(this,(string *)local_828,(string *)local_848);
                    std::__cxx11::string::~string(local_848);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&deviceHandles.
                                       super__Vector_base<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    std::__cxx11::string::~string(local_828);
                    std::__cxx11::string::~string((string *)local_7e8);
                  }
                }
                else {
                  __n = (ulong)local_744;
                  std::allocator<_ze_device_handle_t_*>::allocator(&local_869);
                  std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::vector
                            ((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                              *)local_868,__n,&local_869);
                  std::allocator<_ze_device_handle_t_*>::~allocator(&local_869);
                  uVar6 = properties._32_8_;
                  p_Var3 = (pdVar11->dditable).ze.Device.pfnGet;
                  pp_Var15 = std::
                             vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::
                             data((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                   *)local_868);
                  zVar10 = (*p_Var3)((ze_driver_handle_t)uVar6,&local_744,pp_Var15);
                  if (zVar10 == ZE_RESULT_SUCCESS) {
                    bVar7 = false;
                    bVar4 = false;
                    bVar5 = false;
                    __end3_1 = std::
                               vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                               ::begin((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                        *)local_868);
                    device = (_ze_device_handle_t *)
                             std::
                             vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::
                             end((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>
                                  *)local_868);
                    while (bVar9 = __gnu_cxx::operator!=
                                             (&__end3_1,
                                              (__normal_iterator<_ze_device_handle_t_**,_std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>_>
                                               *)&device), bVar9) {
                      pp_Var16 = __gnu_cxx::
                                 __normal_iterator<_ze_device_handle_t_**,_std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>_>
                                 ::operator*(&__end3_1);
                      deviceProperties.name._248_8_ = *pp_Var16;
                      memset((ze_device_properties_t *)local_a88,0,0x170);
                      local_a88._0_4_ = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
                      deviceProperties.stype = 0;
                      deviceProperties._4_4_ = 0;
                      zVar10 = (*(pdVar11->dditable).ze.Device.pfnGetProperties)
                                         ((ze_device_handle_t)deviceProperties.name._248_8_,
                                          (ze_device_properties_t *)local_a88);
                      if (zVar10 == ZE_RESULT_SUCCESS) {
                        if ((int)deviceProperties.pNext == 1) {
                          if ((deviceProperties.vendorId & 1) == 0) {
                            bVar4 = true;
                          }
                          else {
                            bVar7 = true;
                          }
                        }
                        else {
                          bVar5 = true;
                        }
                      }
                      else if ((this->debugTraceEnabled & 1U) != 0) {
                        std::operator+((char *)local_ac8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"driverSorting ");
                        std::operator+(local_aa8,(char *)local_ac8);
                        std::__cxx11::string::~string(local_ac8);
                        std::__cxx11::string::string(local_ae8,(string *)local_aa8);
                        to_string_abi_cxx11_(local_b08,zVar10);
                        debug_trace_message(this,(string *)local_ae8,(string *)local_b08);
                        std::__cxx11::string::~string((string *)local_b08);
                        std::__cxx11::string::~string(local_ae8);
                        std::__cxx11::string::~string((string *)local_aa8);
                      }
                      __gnu_cxx::
                      __normal_iterator<_ze_device_handle_t_**,_std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>_>
                      ::operator++(&__end3_1);
                    }
                    if (((bVar7) && (bVar4)) && (bVar5)) {
                      pdVar11->driverType = ZEL_DRIVER_TYPE_MIXED;
                    }
                    else if ((bVar7) && (bVar4)) {
                      pdVar11->driverType = ZEL_DRIVER_TYPE_GPU;
                    }
                    else if (bVar7) {
                      pdVar11->driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                    }
                    else if (bVar4) {
                      pdVar11->driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                    }
                    else if (bVar5) {
                      pdVar11->driverType = ZEL_DRIVER_TYPE_OTHER;
                    }
                  }
                  else if ((this->debugTraceEnabled & 1U) != 0) {
                    std::operator+((char *)local_8b0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"driverSorting ");
                    std::operator+(local_890,(char *)local_8b0);
                    std::__cxx11::string::~string(local_8b0);
                    std::__cxx11::string::string(local_8d0,(string *)local_890);
                    to_string_abi_cxx11_(local_8f0,zVar10);
                    debug_trace_message(this,(string *)local_8d0,(string *)local_8f0);
                    std::__cxx11::string::~string((string *)local_8f0);
                    std::__cxx11::string::~string(local_8d0);
                    std::__cxx11::string::~string((string *)local_890);
                  }
                  std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::
                  ~vector((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> *)
                          local_868);
                }
              }
              else if ((this->debugTraceEnabled & 1U) != 0) {
                std::operator+((char *)local_788,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "driverSorting ");
                std::operator+(local_768,(char *)local_788);
                std::__cxx11::string::~string(local_788);
                std::__cxx11::string::string(local_7a8,(string *)local_768);
                to_string_abi_cxx11_(local_7c8,zVar10);
                debug_trace_message(this,(string *)local_7a8,(string *)local_7c8);
                std::__cxx11::string::~string((string *)local_7c8);
                std::__cxx11::string::~string(local_7a8);
                std::__cxx11::string::~string((string *)local_768);
              }
            }
            else if ((this->debugTraceEnabled & 1U) != 0) {
              std::operator+((char *)local_700,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "driverSorting ");
              std::operator+(local_6e0,(char *)local_700);
              std::__cxx11::string::~string(local_700);
              std::__cxx11::string::string(local_720,(string *)local_6e0);
              to_string_abi_cxx11_(local_740,zVar10);
              debug_trace_message(this,(string *)local_720,(string *)local_740);
              std::__cxx11::string::~string((string *)local_740);
              std::__cxx11::string::~string(local_720);
              std::__cxx11::string::~string((string *)local_6e0);
            }
            __gnu_cxx::
            __normal_iterator<_ze_driver_handle_t_**,_std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>_>
            ::operator++(&__end2);
          }
        }
        else if ((this->debugTraceEnabled & 1U) != 0) {
          std::operator+((char *)local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "driverSorting ");
          std::operator+(local_368,(char *)local_388);
          to_string_abi_cxx11_(local_3a8,(ze_init_driver_type_desc_t *)&__range1);
          std::operator+(local_348,local_368);
          std::operator+(local_328,(char *)local_348);
          std::__cxx11::string::~string((string *)local_348);
          std::__cxx11::string::~string((string *)local_3a8);
          std::__cxx11::string::~string((string *)local_368);
          std::__cxx11::string::~string(local_388);
          std::__cxx11::string::string(local_3c8,(string *)local_328);
          to_string_abi_cxx11_(local_3e8,zVar10);
          debug_trace_message(this,(string *)local_3c8,(string *)local_3e8);
          std::__cxx11::string::~string((string *)local_3e8);
          std::__cxx11::string::~string(local_3c8);
          std::__cxx11::string::~string((string *)local_328);
        }
      }
      else if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_2a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "driverSorting ");
        std::operator+(local_288,(char *)local_2a8);
        to_string_abi_cxx11_(local_2c8,(ze_init_driver_type_desc_t *)&__range1);
        std::operator+(local_268,local_288);
        std::operator+(local_248,(char *)local_268);
        std::__cxx11::string::~string((string *)local_268);
        std::__cxx11::string::~string((string *)local_2c8);
        std::__cxx11::string::~string((string *)local_288);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::string::string(local_2e8,(string *)local_248);
        to_string_abi_cxx11_(local_308,zVar10);
        debug_trace_message(this,(string *)local_2e8,(string *)local_308);
        std::__cxx11::string::~string((string *)local_308);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    else if ((this->debugTraceEnabled & 1U) != 0) {
      std::operator+((char *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "driverSorting ");
      std::operator+(local_c8,(char *)local_e8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::string(local_118,(string *)local_c8);
      to_string_abi_cxx11_(local_138,pdVar11->initDriversStatus);
      debug_trace_message(this,(string *)local_118,(string *)local_138);
      std::__cxx11::string::~string((string *)local_138);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string((string *)local_c8);
    }
    std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::~vector
              ((vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> *)local_a0);
    __gnu_cxx::
    __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool context_t::driverSorting(driver_vector_t *drivers, ze_init_driver_type_desc_t* desc, bool sysmanOnly) {
        ze_init_driver_type_desc_t permissiveDesc = {};
        permissiveDesc.stype = ZE_STRUCTURE_TYPE_INIT_DRIVER_TYPE_DESC;
        permissiveDesc.pNext = nullptr;
        permissiveDesc.flags = UINT32_MAX;
        for (auto &driver : *drivers) {
            if (sysmanOnly) {
                for (auto &coreDriver : this->zeDrivers) {
                    if (coreDriver.name == driver.name) {
                        if (!driver.dditable.ze.Global.pfnInitDrivers) {
                            driver.dditable.ze.Global.pfnInitDrivers = coreDriver.dditable.ze.Global.pfnInitDrivers;
                        }
                        if (!driver.dditable.ze.Driver.pfnGet) {
                            driver.dditable.ze.Driver.pfnGet = coreDriver.dditable.ze.Driver.pfnGet;
                        }
                        if (!driver.dditable.ze.Driver.pfnGetProperties) {
                            driver.dditable.ze.Driver.pfnGetProperties = coreDriver.dditable.ze.Driver.pfnGetProperties;
                        }
                        if (!driver.dditable.ze.Device.pfnGet) {
                            driver.dditable.ze.Device.pfnGet = coreDriver.dditable.ze.Device.pfnGet;
                        }
                        if (!driver.dditable.ze.Device.pfnGetProperties) {
                            driver.dditable.ze.Device.pfnGetProperties = coreDriver.dditable.ze.Device.pfnGetProperties;
                        }
                        break;
                    }
                }
            }
            uint32_t pCount = 0;
            std::vector<ze_driver_handle_t> driverHandles;
            ze_result_t res = ZE_RESULT_SUCCESS;
            if (desc && driver.dditable.ze.Global.pfnInitDrivers) {
                if (driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInitDrivers returned ";
                        debug_trace_message(message, loader::to_string(driver.initDriversStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeInitDrivers(" + loader::to_string(&permissiveDesc) + ")";
                    debug_trace_message(message, "");
                }
                pCount = 0;
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, nullptr, &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                // Use the driver's init function to query the driver handles and read the properties.
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, driverHandles.data(), &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else if (driver.dditable.ze.Driver.pfnGet) {
                if (driver.initStatus != ZE_RESULT_SUCCESS || !driver.legacyInitAttempted) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInit returned ";
                        debug_trace_message(message, loader::to_string(driver.initStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeDriverGet";
                    debug_trace_message(message, "");
                }
                res = driver.dditable.ze.Driver.pfnGet(&pCount, nullptr);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                res = driver.dditable.ze.Driver.pfnGet(&pCount, driverHandles.data());
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else {
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " zeDriverGet and zeInitDrivers not supported, skipping driver";
                    debug_trace_message(message, loader::to_string(res));
                }
                continue;
            }

            for (auto handle : driverHandles) {
                ze_driver_properties_t properties = {};
                properties.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
                properties.pNext = nullptr;
                ze_result_t res = driver.dditable.ze.Driver.pfnGetProperties(handle, &properties);
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDriverGetProperties returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driver.properties = properties;
                uint32_t deviceCount = 0;
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, nullptr );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                if (deviceCount == 0) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned 0 devices";
                        debug_trace_message(message, "");
                    }
                    continue;
                }
                std::vector<ze_device_handle_t> deviceHandles(deviceCount);
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, deviceHandles.data() );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                bool integratedGPU = false;
                bool discreteGPU = false;
                bool other = false;
                for( auto device : deviceHandles ) {
                    ze_device_properties_t deviceProperties = {};
                    deviceProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
                    deviceProperties.pNext = nullptr;
                    res = driver.dditable.ze.Device.pfnGetProperties(device, &deviceProperties);
                    if( ZE_RESULT_SUCCESS != res ) {
                        if (debugTraceEnabled) {
                            std::string message = "driverSorting " + driver.name + " failed, zeDeviceGetProperties returned ";
                            debug_trace_message(message, loader::to_string(res));
                        }
                        continue;
                    }
                    if (deviceProperties.type == ZE_DEVICE_TYPE_GPU) {
                        if (deviceProperties.flags & ZE_DEVICE_PROPERTY_FLAG_INTEGRATED) {
                            integratedGPU = true;
                        } else {
                            discreteGPU = true;
                        }
                    } else {
                        other = true;
                    }
                }
                if (integratedGPU && discreteGPU && other) {
                    driver.driverType = ZEL_DRIVER_TYPE_MIXED;
                } else if (integratedGPU && discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_GPU;
                } else if (integratedGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                } else if (discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                } else if (other) {
                    driver.driverType = ZEL_DRIVER_TYPE_OTHER;
                }
            }
        }

        // Sort drivers in ascending order of driver type unless ZE_ENABLE_PCI_ID_DEVICE_ORDER, then in decending order with MIXED and OTHER at the end.
        std::sort(drivers->begin(), drivers->end(), driverSortComparator);

        if (debugTraceEnabled) {
            std::string message = "Drivers after sorting:";
            for (const auto& driver : *drivers) {
                message += "\nDriver Type: " + std::to_string(driver.driverType) + " Driver Name: " + driver.name;
            }
            debug_trace_message(message, "");
        }
        return true;
    }